

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O0

int quicly_decode_ack_frame(uint8_t **src,uint8_t *end,quicly_ack_frame_t *frame,int is_ack_ecn)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t tmp;
  uint64_t i;
  int is_ack_ecn_local;
  quicly_ack_frame_t *frame_local;
  uint8_t *end_local;
  uint8_t **src_local;
  
  uVar1 = quicly_decodev(src,end);
  frame->largest_acknowledged = uVar1;
  if (uVar1 != 0xffffffffffffffff) {
    uVar1 = quicly_decodev(src,end);
    frame->ack_delay = uVar1;
    if (uVar1 != 0xffffffffffffffff) {
      uVar1 = quicly_decodev(src,end);
      frame->num_gaps = uVar1;
      if (((uVar1 != 0xffffffffffffffff) &&
          (uVar1 = quicly_decodev(src,end), uVar1 != 0xffffffffffffffff)) &&
         (uVar1 <= frame->largest_acknowledged)) {
        frame->smallest_acknowledged = frame->largest_acknowledged - uVar1;
        frame->ack_block_lengths[0] = uVar1 + 1;
        tmp = 0;
        while( true ) {
          if (tmp == frame->num_gaps) {
            if (is_ack_ecn != 0) {
              for (tmp = 0; tmp != 3; tmp = tmp + 1) {
                uVar1 = quicly_decodev(src,end);
                if (uVar1 == 0xffffffffffffffff) {
                  return 7;
                }
              }
            }
            return 0;
          }
          uVar1 = quicly_decodev(src,end);
          if (uVar1 == 0xffffffffffffffff) {
            return 7;
          }
          frame->gaps[tmp] = uVar1 + 1;
          if (frame->smallest_acknowledged < frame->gaps[tmp]) break;
          frame->smallest_acknowledged = frame->smallest_acknowledged - frame->gaps[tmp];
          uVar1 = quicly_decodev(src,end);
          if (uVar1 == 0xffffffffffffffff) {
            return 7;
          }
          uVar2 = uVar1 + 1;
          if (frame->smallest_acknowledged < uVar2) {
            return 7;
          }
          frame->ack_block_lengths[tmp + 1] = uVar2;
          frame->smallest_acknowledged = frame->smallest_acknowledged - uVar2;
          tmp = tmp + 1;
        }
        return 7;
      }
    }
  }
  return 7;
}

Assistant:

int quicly_decode_ack_frame(const uint8_t **src, const uint8_t *end, quicly_ack_frame_t *frame, int is_ack_ecn)
{
    uint64_t i, tmp;

    if ((frame->largest_acknowledged = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->ack_delay = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->num_gaps = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;

    if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if (frame->largest_acknowledged < tmp)
        goto Error;
    frame->smallest_acknowledged = frame->largest_acknowledged - tmp;
    frame->ack_block_lengths[0] = tmp + 1;

    for (i = 0; i != frame->num_gaps; ++i) {
        if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        frame->gaps[i] = tmp + 1;
        if (frame->smallest_acknowledged < frame->gaps[i])
            goto Error;
        frame->smallest_acknowledged -= frame->gaps[i];
        if ((tmp = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        tmp += 1;
        if (frame->smallest_acknowledged < tmp)
            goto Error;
        frame->ack_block_lengths[i + 1] = tmp;
        frame->smallest_acknowledged -= tmp;
    }

    if (is_ack_ecn) {
        /* just skip ECT(0), ECT(1), ECT-CE counters for the time being */
        for (i = 0; i != 3; ++i)
            if (quicly_decodev(src, end) == UINT64_MAX)
                goto Error;
    }
    return 0;
Error:
    return QUICLY_ERROR_FRAME_ENCODING;
}